

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O0

void __thiscall
ConfidentialTxIn_EstimateTxInVsize_Test::TestBody(ConfidentialTxIn_EstimateTxInVsize_Test *this)

{
  AddressType addr_type;
  uint32_t pegin_btc_tx_size;
  initializer_list<TestEstimateConfidentialTxInSizeVector> __l;
  bool bVar1;
  int iVar2;
  reference pTVar3;
  ulong uVar4;
  char *message;
  TestEstimateConfidentialTxInSizeVector *local_db8;
  AssertHelper local_b90;
  Message local_b88;
  undefined1 local_b80 [8];
  AssertionResult gtest_ar;
  Message local_b68 [2];
  Script local_b58;
  Script local_b20;
  Script *local_ae8;
  Script *template_ptr;
  Script script_template;
  uint32_t vsize;
  TestEstimateConfidentialTxInSizeVector *test_data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
  *__range1;
  undefined1 local_a78;
  undefined1 local_a77;
  allocator local_a76;
  undefined1 local_a75;
  undefined1 local_a74;
  allocator local_a73;
  undefined1 local_a72;
  undefined1 local_a71;
  allocator local_a70;
  undefined1 local_a6f;
  undefined1 local_a6e;
  allocator local_a6d;
  undefined1 local_a6c;
  undefined1 local_a6b;
  allocator local_a6a;
  allocator local_a69;
  string local_a68;
  undefined1 local_a45;
  undefined1 local_a44;
  allocator local_a43;
  undefined1 local_a42;
  undefined1 local_a41;
  allocator local_a40;
  undefined1 local_a3f;
  undefined1 local_a3e;
  allocator local_a3d;
  undefined1 local_a3c;
  undefined1 local_a3b;
  allocator local_a3a;
  allocator local_a39;
  string local_a38;
  undefined1 local_a11;
  undefined1 local_a10;
  allocator local_a0f;
  undefined1 local_a0e;
  undefined1 local_a0d;
  allocator local_a0c;
  undefined1 local_a0b;
  undefined1 local_a0a;
  allocator local_a09;
  TestEstimateConfidentialTxInSizeVector *local_a08;
  TestEstimateConfidentialTxInSizeVector local_a00;
  undefined4 local_940;
  undefined4 local_93c;
  undefined4 local_938;
  Script local_930;
  undefined4 local_8f8;
  Script SStack_8f0;
  undefined1 local_8b8;
  undefined1 local_8b7;
  undefined1 local_8b6;
  string asStack_8b0 [32];
  undefined4 local_890;
  undefined4 local_88c;
  undefined4 local_888;
  undefined4 local_880;
  undefined4 local_87c;
  undefined4 local_878;
  Script local_870;
  undefined4 local_838;
  Script SStack_830;
  undefined1 local_7f8;
  undefined1 local_7f7;
  undefined1 local_7f6;
  string asStack_7f0 [32];
  undefined4 local_7d0;
  undefined4 local_7cc;
  undefined4 local_7c8;
  undefined4 local_7c0;
  undefined4 local_7bc;
  undefined4 local_7b8;
  Script local_7b0;
  undefined4 local_778;
  Script SStack_770;
  undefined1 local_738;
  undefined1 local_737;
  undefined1 local_736;
  string asStack_730 [32];
  undefined4 local_710;
  undefined4 local_70c;
  undefined4 local_708;
  undefined4 local_700;
  undefined4 local_6fc;
  undefined4 local_6f8;
  Script local_6f0;
  undefined4 local_6b8;
  Script SStack_6b0;
  undefined1 local_678;
  undefined1 local_677;
  undefined1 local_676;
  string asStack_670 [32];
  undefined4 local_650;
  undefined4 local_64c;
  undefined4 local_648;
  undefined4 local_640;
  undefined4 local_63c;
  undefined4 local_638;
  Script local_630;
  undefined4 local_5f8;
  Script SStack_5f0;
  undefined1 local_5b8;
  undefined1 local_5b7;
  undefined1 local_5b6;
  string asStack_5b0 [32];
  undefined4 local_590;
  undefined4 local_58c;
  undefined4 local_588;
  undefined4 local_580;
  undefined4 local_57c;
  undefined4 local_578;
  Script local_570;
  undefined4 local_538;
  Script SStack_530;
  undefined1 local_4f8;
  undefined1 local_4f7;
  undefined1 local_4f6;
  string asStack_4f0 [32];
  undefined4 local_4d0;
  undefined4 local_4cc;
  undefined4 local_4c8;
  undefined4 local_4c0;
  undefined4 local_4bc;
  undefined4 local_4b8;
  Script local_4b0;
  undefined4 local_478;
  Script SStack_470;
  undefined1 local_438;
  undefined1 local_437;
  undefined1 local_436;
  string asStack_430 [32];
  undefined4 local_410;
  undefined4 local_40c;
  undefined4 local_408;
  undefined4 local_400;
  undefined4 local_3fc;
  undefined4 local_3f8;
  Script local_3f0;
  undefined4 local_3b8;
  Script SStack_3b0;
  undefined1 local_378;
  undefined1 local_377;
  undefined1 local_376;
  string asStack_370 [32];
  undefined4 local_350;
  undefined4 local_34c;
  undefined4 local_348;
  undefined4 local_340;
  undefined4 local_33c;
  undefined4 local_338;
  Script local_330;
  undefined4 local_2f8;
  Script SStack_2f0;
  undefined1 local_2b8;
  undefined1 local_2b7;
  undefined1 local_2b6;
  string asStack_2b0 [32];
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  undefined4 local_280;
  undefined4 local_27c;
  undefined4 local_278;
  Script local_270;
  undefined4 local_238;
  Script SStack_230;
  undefined1 local_1f8;
  undefined1 local_1f7;
  undefined1 local_1f6;
  string asStack_1f0 [32];
  undefined4 local_1d0;
  undefined4 local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c0;
  undefined4 local_1bc;
  undefined4 local_1b8;
  Script local_1b0;
  undefined4 local_178;
  Script SStack_170;
  undefined1 local_138;
  undefined1 local_137;
  undefined1 local_136;
  string asStack_130 [32];
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 local_108;
  undefined4 local_100;
  undefined4 local_fc;
  undefined4 local_f8;
  Script local_f0;
  undefined4 local_b8;
  Script SStack_b0;
  undefined1 local_78;
  undefined1 local_77;
  undefined1 local_76;
  string asStack_70 [32];
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  iterator local_40;
  size_type local_38;
  allocator local_19;
  ConfidentialTxIn_EstimateTxInVsize_Test *local_18;
  ConfidentialTxIn_EstimateTxInVsize_Test *this_local;
  
  local_18 = this;
  if ((TestBody()::multisig_script_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&TestBody()::multisig_script_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&TestBody()::multisig_script_abi_cxx11_,
               "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae"
               ,&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
    __cxa_atexit(std::__cxx11::string::~string,&TestBody()::multisig_script_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&TestBody()::multisig_script_abi_cxx11_);
  }
  if ((TestBody()::test_vector == '\0') &&
     (iVar2 = __cxa_guard_acquire(&TestBody()::test_vector), iVar2 != 0)) {
    __range1._4_1_ = 1;
    local_a08 = &local_a00;
    local_a00.addr_type = kP2pkhAddress;
    local_a00.size = 0x96;
    local_a00.witness_size = 0;
    cfd::core::Script::Script(&local_a00.redeem_script);
    local_a0b = 1;
    local_a00.pegin_btc_tx = 0;
    cfd::core::Script::Script(&local_a00.claim_script);
    local_a0a = 1;
    local_a00.is_issuance = false;
    local_a00.is_blind = false;
    local_a00.is_reissuance = false;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a00.script_template,"",&local_a09);
    local_a00.exponent = 0;
    local_a00.minimum_bits = 0;
    local_a00.txoutproof_size = 0;
    local_a0a = 0;
    local_a0b = 0;
    local_a08 = (TestEstimateConfidentialTxInSizeVector *)&local_940;
    local_940 = 1;
    local_93c = 0xcd;
    local_938 = 0;
    cfd::core::Script::Script(&local_930,&exp_script);
    local_a0e = 1;
    local_8f8 = 0;
    cfd::core::Script::Script(&SStack_8f0);
    local_a0d = 1;
    local_8b8 = 0;
    local_8b7 = 0;
    local_8b6 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_8b0,"",&local_a0c);
    local_890 = 0;
    local_88c = 0;
    local_888 = 0;
    local_a0d = 0;
    local_a0e = 0;
    local_a08 = (TestEstimateConfidentialTxInSizeVector *)&local_880;
    local_880 = 6;
    local_87c = 0x5c;
    local_878 = 0;
    cfd::core::Script::Script(&local_870);
    local_a11 = 1;
    local_838 = 0;
    cfd::core::Script::Script(&SStack_830);
    local_a10 = 1;
    local_7f8 = 0;
    local_7f7 = 0;
    local_7f6 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_7f0,"",&local_a0f);
    local_7d0 = 0;
    local_7cc = 0;
    local_7c8 = 0;
    local_a10 = 0;
    local_a11 = 0;
    local_a08 = (TestEstimateConfidentialTxInSizeVector *)&local_7c0;
    local_7c0 = 5;
    local_7bc = 0x71;
    local_7b8 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a38,"51",&local_a39);
    cfd::core::Script::Script(&local_7b0,&local_a38);
    local_a3c = 1;
    local_778 = 0;
    cfd::core::Script::Script(&SStack_770);
    local_a3b = 1;
    local_738 = 0;
    local_737 = 0;
    local_736 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_730,"",&local_a3a);
    local_710 = 0;
    local_70c = 0;
    local_708 = 0;
    local_a3b = 0;
    local_a3c = 0;
    local_a08 = (TestEstimateConfidentialTxInSizeVector *)&local_700;
    local_700 = 4;
    local_6fc = 0x45;
    local_6f8 = 0;
    cfd::core::Script::Script(&local_6f0);
    local_a3f = 1;
    local_6b8 = 0;
    cfd::core::Script::Script(&SStack_6b0);
    local_a3e = 1;
    local_678 = 0;
    local_677 = 0;
    local_676 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_670,"",&local_a3d);
    local_650 = 0;
    local_64c = 0;
    local_648 = 0;
    local_a3e = 0;
    local_a3f = 0;
    local_a08 = (TestEstimateConfidentialTxInSizeVector *)&local_640;
    local_640 = 3;
    local_63c = 0x53;
    local_638 = 0;
    cfd::core::Script::Script(&local_630,&exp_script);
    local_a42 = 1;
    local_5f8 = 0;
    cfd::core::Script::Script(&SStack_5f0);
    local_a41 = 1;
    local_5b8 = 0;
    local_5b7 = 0;
    local_5b6 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_5b0,"",&local_a40);
    local_590 = 0;
    local_58c = 0;
    local_588 = 0;
    local_a41 = 0;
    local_a42 = 0;
    local_a08 = (TestEstimateConfidentialTxInSizeVector *)&local_580;
    local_580 = 3;
    local_57c = 0x6a;
    local_578 = 0;
    cfd::core::Script::Script(&local_570,&TestBody()::multisig_script_abi_cxx11_);
    local_a45 = 1;
    local_538 = 0;
    cfd::core::Script::Script(&SStack_530);
    local_a44 = 1;
    local_4f8 = 0;
    local_4f7 = 0;
    local_4f6 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_4f0,"",&local_a43);
    local_4d0 = 0;
    local_4cc = 0;
    local_4c8 = 0;
    local_a44 = 0;
    local_a45 = 0;
    local_a08 = (TestEstimateConfidentialTxInSizeVector *)&local_4c0;
    local_4c0 = 4;
    local_4bc = 0xfc;
    local_4b8 = 0;
    cfd::core::Script::Script(&local_4b0);
    local_a6c = 1;
    local_478 = 0xe2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_a68,"0014e8d28b573816ddfcf98578d7b28543e273f5a72a",&local_a69);
    cfd::core::Script::Script(&SStack_470,&local_a68);
    local_a6b = 1;
    local_438 = 0;
    local_437 = 0;
    local_436 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_430,"",&local_a6a);
    local_410 = 0;
    local_40c = 0;
    local_408 = 400;
    local_a6b = 0;
    local_a6c = 0;
    local_a08 = (TestEstimateConfidentialTxInSizeVector *)&local_400;
    local_400 = 4;
    local_3fc = 0x97;
    local_3f8 = 0;
    cfd::core::Script::Script(&local_3f0);
    local_a6f = 1;
    local_3b8 = 0;
    cfd::core::Script::Script(&SStack_3b0);
    local_a6e = 1;
    local_378 = 1;
    local_377 = 0;
    local_376 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_370,"",&local_a6d);
    local_350 = 0;
    local_34c = 0;
    local_348 = 0;
    local_a6e = 0;
    local_a6f = 0;
    local_a08 = (TestEstimateConfidentialTxInSizeVector *)&local_340;
    local_340 = 4;
    local_33c = 0x8cd;
    local_338 = 0;
    cfd::core::Script::Script(&local_330);
    local_a72 = 1;
    local_2f8 = 0;
    cfd::core::Script::Script(&SStack_2f0);
    local_a71 = 1;
    local_2b8 = 1;
    local_2b7 = 1;
    local_2b6 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_2b0,"",&local_a70);
    local_290 = 0;
    local_28c = 0x24;
    local_288 = 0;
    local_a71 = 0;
    local_a72 = 0;
    local_a08 = (TestEstimateConfidentialTxInSizeVector *)&local_280;
    local_280 = 4;
    local_27c = 0x8ed;
    local_278 = 0;
    cfd::core::Script::Script(&local_270);
    local_a75 = 1;
    local_238 = 0;
    cfd::core::Script::Script(&SStack_230);
    local_a74 = 1;
    local_1f8 = 1;
    local_1f7 = 1;
    local_1f6 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_1f0,"",&local_a73);
    local_1d0 = 0;
    local_1cc = 0x34;
    local_1c8 = 0;
    local_a74 = 0;
    local_a75 = 0;
    local_a08 = (TestEstimateConfidentialTxInSizeVector *)&local_1c0;
    local_1c0 = 4;
    local_1bc = 0x4ca;
    local_1b8 = 0;
    cfd::core::Script::Script(&local_1b0);
    local_a78 = 1;
    local_178 = 0;
    cfd::core::Script::Script(&SStack_170);
    local_a77 = 1;
    local_138 = 1;
    local_137 = 1;
    local_136 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_130,"",&local_a76);
    local_110 = 0;
    local_10c = 0x24;
    local_108 = 0;
    local_a77 = 0;
    local_a78 = 0;
    local_a08 = (TestEstimateConfidentialTxInSizeVector *)&local_100;
    local_100 = 4;
    local_fc = 0x4da;
    local_f8 = 0;
    cfd::core::Script::Script(&local_f0);
    __range1._5_1_ = 1;
    local_b8 = 0;
    cfd::core::Script::Script(&SStack_b0);
    __range1._6_1_ = 1;
    local_78 = 1;
    local_77 = 1;
    local_76 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_70,"",(allocator *)((long)&__range1 + 7));
    local_50 = 0;
    local_4c = 0x34;
    local_48 = 0;
    __range1._6_1_ = 0;
    __range1._5_1_ = 0;
    __range1._4_1_ = 0;
    local_40 = &local_a00;
    local_38 = 0xd;
    std::allocator<TestEstimateConfidentialTxInSizeVector>::allocator
              ((allocator<TestEstimateConfidentialTxInSizeVector> *)((long)&__range1 + 3));
    __l._M_len = local_38;
    __l._M_array = local_40;
    std::
    vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
    ::vector(&TestBody::test_vector,__l,
             (allocator<TestEstimateConfidentialTxInSizeVector> *)((long)&__range1 + 3));
    std::allocator<TestEstimateConfidentialTxInSizeVector>::~allocator
              ((allocator<TestEstimateConfidentialTxInSizeVector> *)((long)&__range1 + 3));
    local_db8 = (TestEstimateConfidentialTxInSizeVector *)&local_40;
    do {
      local_db8 = local_db8 + -1;
      TestEstimateConfidentialTxInSizeVector::~TestEstimateConfidentialTxInSizeVector(local_db8);
    } while (local_db8 != &local_a00);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    std::allocator<char>::~allocator((allocator<char> *)&local_a76);
    std::allocator<char>::~allocator((allocator<char> *)&local_a73);
    std::allocator<char>::~allocator((allocator<char> *)&local_a70);
    std::allocator<char>::~allocator((allocator<char> *)&local_a6d);
    std::allocator<char>::~allocator((allocator<char> *)&local_a6a);
    std::__cxx11::string::~string((string *)&local_a68);
    std::allocator<char>::~allocator((allocator<char> *)&local_a69);
    std::allocator<char>::~allocator((allocator<char> *)&local_a43);
    std::allocator<char>::~allocator((allocator<char> *)&local_a40);
    std::allocator<char>::~allocator((allocator<char> *)&local_a3d);
    std::allocator<char>::~allocator((allocator<char> *)&local_a3a);
    std::__cxx11::string::~string((string *)&local_a38);
    std::allocator<char>::~allocator((allocator<char> *)&local_a39);
    std::allocator<char>::~allocator((allocator<char> *)&local_a0f);
    std::allocator<char>::~allocator((allocator<char> *)&local_a0c);
    std::allocator<char>::~allocator((allocator<char> *)&local_a09);
    __cxa_atexit(std::
                 vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
                 ::~vector,&TestBody::test_vector,&__dso_handle);
    __cxa_guard_release(&TestBody()::test_vector);
  }
  __end1 = std::
           vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
           ::begin(&TestBody::test_vector);
  test_data = (TestEstimateConfidentialTxInSizeVector *)
              std::
              vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
              ::end(&TestBody::test_vector);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_TestEstimateConfidentialTxInSizeVector_*,_std::vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>_>
                                     *)&test_data), bVar1) {
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_TestEstimateConfidentialTxInSizeVector_*,_std::vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>_>
             ::operator*(&__end1);
    script_template.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    cfd::core::Script::Script((Script *)&template_ptr,&pTVar3->script_template);
    local_ae8 = (Script *)0x0;
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      local_ae8 = (Script *)&template_ptr;
    }
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        addr_type = pTVar3->addr_type;
        cfd::core::Script::Script(&local_b20,&pTVar3->redeem_script);
        pegin_btc_tx_size = pTVar3->pegin_btc_tx;
        cfd::core::Script::Script(&local_b58,&pTVar3->claim_script);
        script_template.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             cfd::core::ConfidentialTxIn::EstimateTxInVsize
                       (addr_type,&local_b20,pegin_btc_tx_size,&local_b58,
                        (bool)(pTVar3->is_issuance & 1),(bool)(pTVar3->is_blind & 1),
                        (bool)(pTVar3->is_reissuance & 1),local_ae8,pTVar3->exponent,
                        pTVar3->minimum_bits,(uint32_t *)0x0,pTVar3->txoutproof_size);
        cfd::core::Script::~Script(&local_b58);
        cfd::core::Script::~Script(&local_b20);
      }
    }
    else {
      testing::Message::Message(local_b68);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x14a,
                 "Expected: (vsize = ConfidentialTxIn::EstimateTxInVsize( test_data.addr_type, test_data.redeem_script, test_data.pegin_btc_tx, test_data.claim_script, test_data.is_issuance, test_data.is_blind, test_data.is_reissuance, template_ptr, test_data.exponent, test_data.minimum_bits, nullptr, test_data.txoutproof_size)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_b68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      testing::Message::~Message(local_b68);
    }
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((EqHelper<false> *)local_b80,"vsize","test_data.size",
               (uint *)((long)&script_template.script_stack_.
                               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),&pTVar3->size
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b80);
    if (!bVar1) {
      testing::Message::Message(&local_b88);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_b80);
      testing::internal::AssertHelper::AssertHelper
                (&local_b90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x14b,message);
      testing::internal::AssertHelper::operator=(&local_b90,&local_b88);
      testing::internal::AssertHelper::~AssertHelper(&local_b90);
      testing::Message::~Message(&local_b88);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b80);
    cfd::core::Script::~Script((Script *)&template_ptr);
    __gnu_cxx::
    __normal_iterator<const_TestEstimateConfidentialTxInSizeVector_*,_std::vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

TEST(ConfidentialTxIn, EstimateTxInVsize) {
  static const std::string multisig_script = "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae";
  static const std::vector<TestEstimateConfidentialTxInSizeVector> test_vector = {
    {AddressType::kP2pkhAddress, 150, 0, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shAddress, 205, 0, exp_script, 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shP2wpkhAddress, 92, 0, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shP2wshAddress, 113, 0, Script("51"), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wpkhAddress, 69, 0, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wshAddress, 83, 0, exp_script, 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wshAddress, 106, 0, Script(multisig_script), 0, Script(), false, false, false, "", 0, 0, 0},
    // pegin
    {AddressType::kP2wpkhAddress, 252, 0, Script(), 226,
     Script("0014e8d28b573816ddfcf98578d7b28543e273f5a72a"), false, false, false, "", 0, 0, 400},
    // issue
    {AddressType::kP2wpkhAddress, 151, 0, Script(), 0, Script(), true, false, false, "", 0, 0, 0},
    {AddressType::kP2wpkhAddress, /*1645*/ 2253, 0, Script(), 0, Script(), true, true, false, "", 0, 36, 0},
    {AddressType::kP2wpkhAddress, 2285, 0, Script(), 0, Script(), true, true, false, "", 0, 52, 0},
    // reissue
    {AddressType::kP2wpkhAddress, /*922*/ 1226, 0, Script(), 0, Script(), true, true, true, "", 0, 36, 0},
    {AddressType::kP2wpkhAddress, 1242, 0, Script(), 0, Script(), true, true, true, "", 0, 52, 0},
  };

  for (const auto& test_data : test_vector) {
    uint32_t vsize = 0;
    Script script_template(test_data.script_template);
    Script* template_ptr = nullptr;
    if (!test_data.script_template.empty()) {
      template_ptr = &script_template;
    }
    EXPECT_NO_THROW((vsize = ConfidentialTxIn::EstimateTxInVsize(
        test_data.addr_type, test_data.redeem_script, test_data.pegin_btc_tx,
        test_data.claim_script, test_data.is_issuance, test_data.is_blind,
        test_data.is_reissuance, template_ptr,
        test_data.exponent, test_data.minimum_bits, nullptr,
        test_data.txoutproof_size)));
    EXPECT_EQ(vsize, test_data.size);
  }
}